

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase34::run(TestCase34 *this)

{
  UnwindDetector *this_00;
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  size_t __n;
  ArrayPtr<const_unsigned_char> AVar4;
  bool local_108;
  char local_107 [6];
  char local_101;
  bool _kj_shouldLog;
  char buf [7];
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  undefined1 local_d8 [8];
  ArrayPtr<const_unsigned_char> pieces [5];
  AutoCloseFd local_80;
  undefined1 local_78 [8];
  FdOutputStream out;
  undefined1 local_58 [8];
  FdInputStream in;
  Fault local_30;
  Fault f;
  SyscallResult local_1c;
  undefined1 local_18 [4];
  SyscallResult _kjSyscallResult;
  int fds [2];
  TestCase34 *this_local;
  
  f.exception = (Exception *)local_18;
  local_1c = _::Debug::syscall<kj::(anonymous_namespace)::TestCase34::run()::__0>
                       ((anon_class_8_1_ba1d46d5 *)&f,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_1c);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_1c);
    _::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
               ,0x27,iVar1,"miniposix::pipe(fds)","");
    _::Debug::Fault::fatal(&local_30);
  }
  this_00 = &out.autoclose.unwindDetector;
  AutoCloseFd::AutoCloseFd((AutoCloseFd *)this_00,(int)local_18);
  FdInputStream::FdInputStream((FdInputStream *)local_58,(AutoCloseFd *)this_00);
  AutoCloseFd::~AutoCloseFd((AutoCloseFd *)&out.autoclose.unwindDetector);
  AutoCloseFd::AutoCloseFd(&local_80,_kjSyscallResult.errorNumber);
  FdOutputStream::FdOutputStream((FdOutputStream *)local_78,&local_80);
  AutoCloseFd::~AutoCloseFd(&local_80);
  local_e0 = (void *)0x0;
  puVar3 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_e0);
  AVar4 = arrayPtr<unsigned_char_const>(puVar3,0);
  pieces[0].ptr = (uchar *)AVar4.size_;
  local_d8 = (undefined1  [8])AVar4.ptr;
  pieces._8_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>("foo",3);
  local_e8 = (void *)0x0;
  puVar3 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_e8);
  pieces._24_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>(puVar3,0);
  pieces._40_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>("bar",3);
  local_f0 = (void *)0x0;
  puVar3 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_f0);
  pieces._56_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>(puVar3,0);
  __n = pieces[4].ptr;
  ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>::ArrayPtr<5ul>
            ((ArrayPtr<kj::ArrayPtr<unsigned_char_const>const> *)&_kj_shouldLog,
             (ArrayPtr<const_unsigned_char> (*) [5])local_d8);
  FdOutputStream::write((FdOutputStream *)local_78,__kj_shouldLog,local_f8,__n);
  InputStream::read((InputStream *)local_58,(int)local_107,(void *)0x6,__n);
  local_101 = '\0';
  iVar1 = strcmp("foobar",local_107);
  if (iVar1 != 0) {
    local_108 = _::Debug::shouldLog(ERROR);
    while (local_108 != false) {
      _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[7]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io-test.c++"
                 ,0x3a,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
                 (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
                 (char (*) [7])"foobar",(char (*) [7])local_107);
      local_108 = false;
    }
  }
  FdOutputStream::~FdOutputStream((FdOutputStream *)local_78);
  FdInputStream::~FdInputStream((FdInputStream *)local_58);
  return;
}

Assistant:

TEST(Io, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays are empty.  (This
  // used to not work in some cases.)

  int fds[2];
  KJ_SYSCALL(miniposix::pipe(fds));

  FdInputStream in((AutoCloseFd(fds[0])));
  FdOutputStream out((AutoCloseFd(fds[1])));

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("foo"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("bar"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  char buf[7];
  in.read(buf, 6);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}